

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonAST.hpp
# Opt level: O2

void __thiscall antlr::CommonAST::initialize(CommonAST *this,RefAST *t)

{
  uint uVar1;
  string local_30 [32];
  
  uVar1 = (*t->ref->ptr->_vptr_AST[0x10])();
  (*(this->super_BaseAST).super_AST._vptr_AST[0x17])(this,(ulong)uVar1);
  (*t->ref->ptr->_vptr_AST[0xf])(local_30);
  (*(this->super_BaseAST).super_AST._vptr_AST[0x16])(this,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

virtual void initialize( RefAST t )
	{
		setType(t->getType());
		setText(t->getText());
	}